

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_node_<true,true,false,double_const&>
          (Simplex_tree<MiniSTOptions> *this,Siblings *sib,Vertex_handle v,double *filtration_value)

{
  __node_base_ptr p_Var1;
  undefined6 in_register_00000012;
  ulong uVar2;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  *ret_val;
  pair<boost::container::vec_iterator<boost::container::dtl::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  pVar3;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  pVar4;
  ushort local_3a;
  __node_base local_38;
  short local_30 [4];
  __buckets_ptr local_28;
  undefined1 local_20;
  
  local_38._M_nxt = (_Hash_node_base *)CONCAT62(in_register_00000012,v);
  local_3a = (ushort)filtration_value;
  local_30[0] = 0;
  local_30[1] = 0;
  local_30[2] = 0;
  local_30[3] = 0;
  pVar3 = boost::container::dtl::
          flat_tree<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>>,boost::container::dtl::select1st<short>,std::less<short>,boost::container::new_allocator<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>>>>
          ::
          try_emplace<short_const&,Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<MiniSTOptions>,boost::container::flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>,std::less<short>,void>>*&,double_const&>
                    ((flat_tree<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>>,boost::container::dtl::select1st<short>,std::less<short>,boost::container::new_allocator<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>>>>
                      *)&local_28,(const_iterator *)(local_38._M_nxt + 2),local_30,
                     (Simplex_tree_siblings<Gudhi::Simplex_tree<MiniSTOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>,_std::less<short>,_void>_>
                      **)&local_3a,(double *)&local_38);
  uVar2 = pVar3._8_8_;
  (this->nodes_label_to_list_)._M_h._M_buckets = local_28;
  *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_20;
  if (*(short *)&local_28[2][1]._M_nxt != *(short *)local_28) {
    p_Var1 = (__node_base_ptr)operator_new(0x28);
    uVar2 = (ulong)local_3a;
    p_Var1->_M_nxt = local_38._M_nxt;
    *(ushort *)&p_Var1[1]._M_nxt = local_3a;
    p_Var1[2]._M_nxt = (_Hash_node_base *)0x0;
    p_Var1[3]._M_nxt = (_Hash_node_base *)0x0;
    p_Var1[4]._M_nxt = (_Hash_node_base *)0x0;
    local_28[2] = p_Var1;
  }
  pVar4._8_8_ = uVar2;
  pVar4.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
        *)this;
  return pVar4;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }